

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Node.cpp
# Opt level: O0

bool __thiscall Node::removePredecessor(Node *this,Node *node)

{
  size_type sVar1;
  long in_RSI;
  set<Node_*,_std::less<Node_*>,_std::allocator<Node_*>_> *in_RDI;
  set<Node_*,_std::less<Node_*>,_std::allocator<Node_*>_> *in_stack_ffffffffffffffe0;
  undefined1 local_1;
  
  if (in_RSI == 0) {
    local_1 = false;
  }
  else {
    std::set<Node_*,_std::less<Node_*>,_std::allocator<Node_*>_>::erase
              (in_stack_ffffffffffffffe0,(key_type *)in_RDI);
    sVar1 = std::set<Node_*,_std::less<Node_*>,_std::allocator<Node_*>_>::erase
                      (in_RDI,(key_type *)in_RDI);
    local_1 = sVar1 != 0;
  }
  return local_1;
}

Assistant:

bool Node::removePredecessor(Node *node) {
    if (!node) {
        return false;
    }
    predecessors_.erase(node);
    return node->successors_.erase(this);
}